

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsdeviceintegration.cpp
# Opt level: O3

int __thiscall QEglFSDeviceIntegration::framebufferIndex(QEglFSDeviceIntegration *this)

{
  int *piVar1;
  undefined1 *puVar2;
  char cVar3;
  long lVar4;
  int iVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QStringView QVar8;
  QFileInfo fbinfo;
  QRegularExpressionMatch match;
  QRegularExpression fbIndexRx;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  storage_type *local_58;
  undefined1 *local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QVar6.m_data = (storage_type *)0x7;
  QVar6.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar6);
  local_68 = (QArrayData *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_);
  uStack_60 = local_48.d.ptr._0_4_;
  uStack_5c = local_48.d.ptr._4_4_;
  local_58 = (storage_type *)local_48.d.size;
  QRegularExpression::QRegularExpression((QRegularExpression *)&local_50,&local_68,0);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  (*this->_vptr_QEglFSDeviceIntegration[0x1d])(&local_68,this);
  QVar7.m_data = local_58;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromLocal8Bit(QVar7);
  QFileInfo::QFileInfo((QFileInfo *)&local_70,&local_48);
  piVar1 = (int *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_),2,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,1,0x10);
    }
  }
  local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  QRegularExpressionMatch::QRegularExpressionMatch((QRegularExpressionMatch *)&local_68);
  cVar3 = QFileInfo::isSymLink();
  if (cVar3 == '\0') {
    QFileInfo::fileName();
  }
  else {
    QFileInfo::symLinkTarget();
  }
  QRegularExpression::match(&local_78,&local_50,&local_48,0,0,0);
  puVar2 = (undefined1 *)local_68;
  local_68 = (QArrayData *)local_78;
  local_78 = puVar2;
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_78);
  piVar1 = (int *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_),2,0x10);
    }
  }
  cVar3 = QRegularExpressionMatch::hasMatch();
  iVar5 = 0;
  if (cVar3 != '\0') {
    QRegularExpressionMatch::captured((int)&local_48);
    QVar8.m_data._4_4_ = local_48.d.ptr._4_4_;
    QVar8.m_data._0_4_ = local_48.d.ptr._0_4_;
    QVar8.m_size = local_48.d.size;
    lVar4 = QString::toIntegral_helper(QVar8,(bool *)0x0,10);
    iVar5 = (int)lVar4;
    if ((int)lVar4 != lVar4) {
      iVar5 = 0;
    }
    piVar1 = (int *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_),2,0x10)
        ;
      }
    }
  }
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_68);
  QFileInfo::~QFileInfo((QFileInfo *)&local_70);
  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

int QEglFSDeviceIntegration::framebufferIndex() const
{
    int fbIndex = 0;
#if QT_CONFIG(regularexpression)
    QRegularExpression fbIndexRx("fb(\\d+)"_L1);
    QFileInfo fbinfo(QString::fromLocal8Bit(fbDeviceName()));
    QRegularExpressionMatch match;
    if (fbinfo.isSymLink())
        match = fbIndexRx.match(fbinfo.symLinkTarget());
    else
        match = fbIndexRx.match(fbinfo.fileName());
    if (match.hasMatch())
        fbIndex = match.captured(1).toInt();
#endif
    return fbIndex;
}